

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int vorbis_decode_packet(vorb *f,int *len,int *p_left,int *p_right)

{
  Floor *pFVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint16 uVar6;
  ushort uVar7;
  int iVar8;
  int32 n;
  Floor *pFVar9;
  int16 *piVar10;
  float *pfVar11;
  short *psVar12;
  uint uVar13;
  int iVar14;
  uint32 uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  byte *pbVar22;
  short sVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  float *pfVar34;
  float *a;
  ulong uVar35;
  int iVar36;
  uint uVar37;
  uint8 *puVar38;
  long lVar39;
  Codebook *pCVar40;
  long lVar41;
  bool bVar42;
  float fVar43;
  float fVar44;
  int n2;
  int right_end;
  int mode;
  int left_end;
  float *residue_buffers [16];
  int really_zero_channel [256];
  int zero_channel [256];
  int local_9f0;
  int local_9ec;
  int *local_9e8;
  int *local_9e0;
  long local_9d8;
  long local_9d0;
  Floor *local_9c8;
  int local_9bc;
  float *local_9b8 [16];
  uint8 local_938 [256];
  undefined4 local_838;
  int local_438 [258];
  
  local_9e0 = len;
  iVar14 = vorbis_decode_initial(f,p_left,&local_9bc,p_right,&local_9f0,&local_9ec);
  if (iVar14 == 0) {
LAB_0015ebd1:
    iVar14 = 0;
  }
  else {
    lVar20 = (long)local_9ec;
    local_9d8 = lVar20 * 3;
    iVar14 = *p_left;
    iVar8 = *p_right;
    iVar19 = f->blocksize[f->mode_config[lVar20].blockflag];
    puVar38 = f->mapping->submap_floor +
              ((ulong)((uint)f->mode_config[lVar20].mapping * 0x30) - 0x11);
    iVar16 = f->channels;
    local_9e8 = p_left;
    if (0 < iVar16) {
      lVar20 = 0;
      do {
        bVar3 = *(byte *)(*(long *)(puVar38 + 8) + 2 + lVar20 * 3);
        local_438[lVar20] = 0;
        uVar30 = (ulong)puVar38[(ulong)bVar3 + 0x11];
        uVar6 = f->floor_types[uVar30];
        if (uVar6 == 0) {
          f->error = VORBIS_invalid_stream;
        }
        else {
          pFVar9 = f->floor_config;
          uVar15 = get_bits(f,1);
          if (uVar15 != 0) {
            local_9d0 = uVar30 * 0x63c;
            pFVar1 = pFVar9 + uVar30;
            n = *(int32 *)("" + (ulong)(pFVar1->floor1).floor1_multiplier * 4 + 0xc);
            piVar10 = f->finalY[lVar20];
            local_9c8 = pFVar9;
            iVar16 = ilog(n);
            uVar15 = get_bits(f,iVar16 + -1);
            *piVar10 = (int16)uVar15;
            uVar15 = get_bits(f,iVar16 + -1);
            piVar10[1] = (int16)uVar15;
            if ((pFVar1->floor0).order != '\0') {
              lVar32 = 2;
              uVar30 = 0;
              do {
                bVar3 = *(byte *)((long)pFVar1 + uVar30 + 1);
                uVar35 = (ulong)bVar3;
                uVar18 = (uint)*(byte *)((long)pFVar1 + uVar35 + 0x21);
                bVar4 = *(byte *)((long)pFVar1 + uVar35 + 0x31);
                if (bVar4 == 0) {
                  uVar27 = 0;
                }
                else {
                  pCVar40 = f->codebooks + *(byte *)((long)pFVar1 + uVar35 + 0x41);
                  if (f->valid_bits < 10) {
                    if (f->valid_bits == 0) {
                      f->acc = 0;
                    }
                    do {
                      if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
                         (iVar16 = get8_packet_raw(f), iVar16 == -1)) break;
                      iVar28 = f->valid_bits;
                      f->acc = f->acc + (iVar16 << ((byte)iVar28 & 0x1f));
                      f->valid_bits = iVar28 + 8;
                    } while (iVar28 < 0x11);
                  }
                  sVar23 = pCVar40->fast_huffman[f->acc & 0x3ff];
                  if (sVar23 < 0) {
                    uVar27 = codebook_decode_scalar_raw(f,pCVar40);
                  }
                  else {
                    bVar5 = pCVar40->codeword_lengths[(int)sVar23];
                    f->acc = f->acc >> (bVar5 & 0x1f);
                    iVar16 = f->valid_bits - (uint)bVar5;
                    bVar42 = iVar16 < 0;
                    if (iVar16 < 1) {
                      iVar16 = 0;
                    }
                    uVar27 = (int)sVar23;
                    if (bVar42) {
                      uVar27 = 0xffffffff;
                    }
                    f->valid_bits = iVar16;
                  }
                  if (pCVar40->sparse != '\0') {
                    uVar27 = pCVar40->sorted_values[(int)uVar27];
                  }
                }
                if (uVar18 != 0) {
                  lVar32 = (long)(int)lVar32;
                  uVar37 = 0;
                  do {
                    lVar21 = (long)*(short *)((long)pFVar1 +
                                             (ulong)(uVar27 & ~(-1 << (bVar4 & 0x1f))) * 2 +
                                             (ulong)bVar3 * 0x10 + 0x52);
                    uVar27 = (int)uVar27 >> (bVar4 & 0x1f);
                    if (lVar21 < 0) {
                      iVar16 = 0;
                    }
                    else {
                      pCVar40 = f->codebooks + lVar21;
                      if (f->valid_bits < 10) {
                        if (f->valid_bits == 0) {
                          f->acc = 0;
                        }
                        do {
                          if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
                             (iVar16 = get8_packet_raw(f), iVar16 == -1)) break;
                          iVar28 = f->valid_bits;
                          f->acc = f->acc + (iVar16 << ((byte)iVar28 & 0x1f));
                          f->valid_bits = iVar28 + 8;
                        } while (iVar28 < 0x11);
                      }
                      iVar16 = (int)pCVar40->fast_huffman[f->acc & 0x3ff];
                      if (pCVar40->fast_huffman[f->acc & 0x3ff] < 0) {
                        iVar16 = codebook_decode_scalar_raw(f,pCVar40);
                      }
                      else {
                        bVar5 = pCVar40->codeword_lengths[iVar16];
                        f->acc = f->acc >> (bVar5 & 0x1f);
                        iVar24 = f->valid_bits - (uint)bVar5;
                        iVar28 = iVar24;
                        if (iVar24 < 1) {
                          iVar28 = 0;
                        }
                        if (iVar24 < 0) {
                          iVar16 = -1;
                        }
                        f->valid_bits = iVar28;
                      }
                      if (pCVar40->sparse != '\0') {
                        iVar16 = pCVar40->sorted_values[iVar16];
                      }
                    }
                    piVar10[lVar32] = (int16)iVar16;
                    lVar32 = lVar32 + 1;
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != uVar18);
                }
                uVar30 = uVar30 + 1;
              } while (uVar30 < (pFVar1->floor0).order);
            }
            if (f->valid_bits != -1) {
              local_838._0_2_ = 0x101;
              iVar16 = (pFVar1->floor1).values;
              lVar32 = (long)iVar16;
              if (2 < lVar32) {
                lVar21 = 0;
                do {
                  bVar3 = *(byte *)((long)local_9c8 + lVar21 * 2 + local_9d0 + 0x444);
                  bVar4 = *(byte *)((long)local_9c8 + lVar21 * 2 + local_9d0 + 0x445);
                  iVar24 = (int)*(short *)((long)piVar10 + (ulong)((uint)bVar3 + (uint)bVar3));
                  iVar28 = (int)*(short *)((long)piVar10 + (ulong)((uint)bVar4 + (uint)bVar4));
                  uVar37 = (uint)*(ushort *)
                                  ((long)pFVar1 + (ulong)((uint)bVar3 + (uint)bVar3) + 0x152);
                  uVar27 = iVar28 - iVar24;
                  uVar18 = -uVar27;
                  if (0 < (int)uVar27) {
                    uVar18 = uVar27;
                  }
                  iVar17 = (int)((*(ushort *)((long)local_9c8 + lVar21 * 2 + local_9d0 + 0x156) -
                                 uVar37) * (uVar18 & 0xffff)) /
                           (int)(*(ushort *)
                                  ((long)pFVar1 + (ulong)((uint)bVar4 + (uint)bVar4) + 0x152) -
                                uVar37);
                  iVar25 = -iVar17;
                  if (-1 < iVar28 - iVar24) {
                    iVar25 = iVar17;
                  }
                  iVar25 = iVar25 + iVar24;
                  sVar23 = piVar10[lVar21 + 2];
                  uVar18 = (uint)sVar23;
                  if (uVar18 == 0) {
                    *(undefined1 *)((long)&local_838 + lVar21 + 2) = 0;
LAB_0015e71c:
                    sVar23 = (short)iVar25;
LAB_0015e721:
                    piVar10[lVar21 + 2] = sVar23;
                  }
                  else {
                    iVar24 = n - iVar25;
                    iVar28 = iVar25;
                    if (iVar24 < iVar25) {
                      iVar28 = iVar24;
                    }
                    *(undefined1 *)((long)&local_838 + (ulong)bVar4) = 1;
                    *(undefined1 *)((long)&local_838 + (ulong)bVar3) = 1;
                    *(undefined1 *)((long)&local_838 + lVar21 + 2) = 1;
                    if ((int)uVar18 < iVar28 * 2) {
                      if ((uVar18 & 1) == 0) {
                        iVar25 = iVar25 + (uVar18 >> 1);
                      }
                      else {
                        iVar25 = iVar25 - (uVar18 + 1 >> 1);
                      }
                      goto LAB_0015e71c;
                    }
                    if (iVar24 <= iVar25) {
                      sVar23 = ((short)iVar25 - sVar23) + (short)iVar24 + -1;
                      goto LAB_0015e721;
                    }
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar32 + -2 != lVar21);
              }
              if (0 < iVar16) {
                lVar21 = 0;
                do {
                  if (*(char *)((long)&local_838 + lVar21) == '\0') {
                    piVar10[lVar21] = -1;
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar32 != lVar21);
              }
              goto LAB_0015e78f;
            }
          }
          local_438[lVar20] = 1;
        }
LAB_0015e78f:
        if (uVar6 == 0) goto LAB_0015ebd1;
        lVar20 = lVar20 + 1;
        iVar16 = f->channels;
      } while (lVar20 < iVar16);
    }
    memcpy(&local_838,local_438,(long)iVar16 << 2);
    uVar7 = *(ushort *)puVar38;
    if ((ulong)uVar7 != 0) {
      lVar20 = *(long *)(puVar38 + 8);
      lVar32 = 0;
      do {
        bVar3 = *(byte *)(lVar20 + lVar32);
        if ((local_438[bVar3] == 0) || (local_438[*(byte *)(lVar20 + 1 + lVar32)] == 0)) {
          local_438[*(byte *)(lVar20 + 1 + lVar32)] = 0;
          local_438[bVar3] = 0;
        }
        lVar32 = lVar32 + 3;
      } while ((ulong)uVar7 * 3 != lVar32);
    }
    uVar18 = iVar19 >> 1;
    if (puVar38[0x10] != '\0') {
      uVar30 = 0;
      do {
        iVar16 = f->channels;
        iVar28 = 0;
        if (0 < (long)iVar16) {
          pbVar22 = (byte *)(*(long *)(puVar38 + 8) + 2);
          lVar20 = 0;
          iVar28 = 0;
          do {
            if (uVar30 == *pbVar22) {
              if (local_438[lVar20] == 0) {
                local_938[iVar28] = '\0';
                pfVar34 = f->channel_buffers[lVar20];
              }
              else {
                local_938[iVar28] = '\x01';
                pfVar34 = (float *)0x0;
              }
              local_9b8[iVar28] = pfVar34;
              iVar28 = iVar28 + 1;
            }
            lVar20 = lVar20 + 1;
            pbVar22 = pbVar22 + 3;
          } while (iVar16 != lVar20);
        }
        decode_residue(f,local_9b8,iVar28,uVar18,(uint)puVar38[uVar30 + 0x20],local_938);
        uVar30 = uVar30 + 1;
      } while (uVar30 < puVar38[0x10]);
    }
    if ((ulong)*(ushort *)puVar38 != 0) {
      lVar20 = *(long *)(puVar38 + 8);
      uVar30 = (ulong)*(ushort *)puVar38;
      do {
        if (0 < (int)uVar18) {
          lVar32 = (uVar30 - 1) * 3;
          pfVar34 = f->channel_buffers[*(byte *)(lVar20 + lVar32)];
          pfVar11 = f->channel_buffers[*(byte *)(lVar20 + 1 + lVar32)];
          uVar35 = 0;
          do {
            fVar44 = pfVar34[uVar35];
            fVar2 = pfVar11[uVar35];
            fVar43 = fVar44;
            if (fVar44 <= 0.0) {
              if (fVar2 <= 0.0) {
                fVar43 = fVar44 - fVar2;
              }
              else {
                fVar44 = fVar2 + fVar44;
              }
            }
            else if (fVar2 <= 0.0) {
              fVar43 = fVar2 + fVar44;
            }
            else {
              fVar44 = fVar44 - fVar2;
            }
            pfVar34[uVar35] = fVar43;
            pfVar11[uVar35] = fVar44;
            uVar35 = uVar35 + 1;
          } while (uVar18 != uVar35);
        }
        bVar42 = 1 < (long)uVar30;
        uVar30 = uVar30 - 1;
      } while (bVar42);
    }
    if (0 < f->channels) {
      lVar20 = 0;
      do {
        pfVar34 = f->channel_buffers[lVar20];
        if ((&local_838)[lVar20] == 0) {
          if (f->floor_types
              [puVar38[(ulong)*(byte *)(*(long *)(puVar38 + 8) + 2 + lVar20 * 3) + 0x11]] == 0) {
            f->error = VORBIS_invalid_stream;
          }
          else {
            psVar12 = f->finalY[lVar20];
            pFVar9 = f->floor_config;
            lVar32 = (ulong)puVar38[(ulong)*(byte *)(*(long *)(puVar38 + 8) + 2 + lVar20 * 3) + 0x11
                                   ] * 0x63c;
            bVar3 = *(byte *)((long)pFVar9 + lVar32 + 0x634);
            uVar37 = (int)*psVar12 * (uint)bVar3;
            lVar21 = (long)*(int *)((long)pFVar9 + lVar32 + 0x638);
            uVar27 = 0;
            if (1 < lVar21) {
              uVar27 = 0;
              lVar39 = 1;
              do {
                uVar30 = (ulong)*(byte *)((long)pFVar9 + lVar39 + lVar32 + 0x346);
                sVar23 = psVar12[uVar30];
                uVar26 = uVar37;
                uVar31 = uVar27;
                if (-1 < sVar23) {
                  uVar26 = (int)sVar23 * (uint)bVar3;
                  uVar7 = *(ushort *)((long)pFVar9 + uVar30 * 2 + lVar32 + 0x152);
                  iVar16 = uVar7 - uVar27;
                  uVar31 = (uint)uVar7;
                  if (iVar16 != 0) {
                    iVar24 = uVar26 - uVar37;
                    iVar28 = -iVar24;
                    if (0 < iVar24) {
                      iVar28 = iVar24;
                    }
                    iVar17 = iVar24 / iVar16;
                    iVar25 = -iVar17;
                    if (0 < iVar17) {
                      iVar25 = iVar17;
                    }
                    uVar13 = uVar18;
                    if ((int)(uint)uVar7 < (int)uVar18) {
                      uVar13 = uVar31;
                    }
                    if ((int)uVar27 < (int)uVar13) {
                      pfVar34[uVar27] = inverse_db_table[uVar37 & 0xff] * pfVar34[uVar27];
                      if ((int)(uVar27 + 1) < (int)uVar13) {
                        iVar36 = 0;
                        lVar41 = 1;
                        do {
                          iVar36 = iVar36 + (iVar28 - iVar25 * iVar16);
                          uVar33 = 0;
                          iVar29 = 0;
                          if (iVar16 <= iVar36) {
                            uVar33 = iVar24 >> 0x1f | 1;
                            iVar29 = iVar16;
                          }
                          uVar37 = uVar37 + iVar17 + uVar33;
                          iVar36 = iVar36 - iVar29;
                          pfVar34[(ulong)uVar27 + lVar41] =
                               inverse_db_table[uVar37 & 0xff] * pfVar34[(ulong)uVar27 + lVar41];
                          lVar41 = lVar41 + 1;
                        } while (uVar13 - uVar27 != (int)lVar41);
                      }
                    }
                  }
                }
                uVar27 = uVar31;
                uVar37 = uVar26;
                lVar39 = lVar39 + 1;
              } while (lVar39 != lVar21);
            }
            if ((int)uVar27 < (int)uVar18) {
              fVar44 = inverse_db_table[(int)uVar37];
              uVar30 = (ulong)uVar27;
              do {
                pfVar34[uVar30] = pfVar34[uVar30] * fVar44;
                uVar30 = uVar30 + 1;
              } while ((long)(int)uVar18 != uVar30);
            }
          }
        }
        else {
          memset(pfVar34,0,(long)(int)uVar18 * 4);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < f->channels);
    }
    if (0 < f->channels) {
      lVar20 = local_9d8 * 2;
      lVar32 = 0;
      do {
        inverse_mdct(f->channel_buffers[lVar32],iVar19,f,
                     (uint)(&f->mode_config[0].blockflag)[lVar20]);
        lVar32 = lVar32 + 1;
      } while (lVar32 < f->channels);
    }
    do {
      iVar16 = get8_packet_raw(f);
    } while (iVar16 != -1);
    if (f->first_decode == '\0') {
      iVar19 = f->discard_samples_deferred;
      if (iVar19 != 0) {
        if (iVar19 < iVar8 - iVar14) {
          *local_9e8 = iVar14 + iVar19;
          f->discard_samples_deferred = 0;
          iVar14 = iVar14 + iVar19;
        }
        else {
          f->discard_samples_deferred = iVar19 - (iVar8 - iVar14);
          *local_9e8 = iVar8;
          iVar14 = iVar8;
        }
      }
    }
    else {
      f->current_loc = -uVar18;
      f->discard_samples_deferred = iVar19 - local_9f0;
      f->current_loc_valid = 1;
      f->first_decode = '\0';
    }
    if (f->last_seg_which == f->end_seg_with_known_loc) {
      if ((f->current_loc_valid != 0) && ((f->page_flag & 4) != 0)) {
        uVar27 = f->current_loc;
        uVar37 = f->known_loc_for_packet;
        uVar26 = (local_9f0 - iVar14) + uVar27;
        iVar19 = 0;
        if (uVar37 < uVar26) {
          iVar19 = uVar37 - uVar27;
          if (uVar37 < uVar27) {
            iVar19 = 0;
          }
          iVar16 = iVar19 + iVar14;
          if (local_9f0 <= iVar19 + iVar14) {
            iVar16 = local_9f0;
          }
          *local_9e0 = iVar16;
          f->current_loc = f->current_loc + iVar16;
          iVar19 = 1;
        }
        if (uVar37 < uVar26) {
          return iVar19;
        }
      }
      f->current_loc = (iVar14 - uVar18) + f->known_loc_for_packet;
      f->current_loc_valid = 1;
    }
    if (f->current_loc_valid != 0) {
      f->current_loc = f->current_loc + (iVar8 - iVar14);
    }
    *local_9e0 = local_9f0;
    iVar14 = 1;
  }
  return iVar14;
}

Assistant:

static int vorbis_decode_packet(vorb *f, int *len, int *p_left, int *p_right)
{
   int mode, left_end, right_end;
   if (!vorbis_decode_initial(f, p_left, &left_end, p_right, &right_end, &mode)) return 0;
   return vorbis_decode_packet_rest(f, len, f->mode_config + mode, *p_left, left_end, *p_right, right_end, p_left);
}